

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.hpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test8::_argument_list_tree_node::~_argument_list_tree_node
          (_argument_list_tree_node *this)

{
  pointer pp_Var1;
  _argument_list_tree_node *this_00;
  pointer pp_Var2;
  
  pp_Var2 = (this->children).
            super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pp_Var1 = (this->children).
                   super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pp_Var1 != pp_Var2) {
    this_00 = pp_Var1[-1];
    (this->children).
    super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = pp_Var1 + -1;
    if (this_00 != (_argument_list_tree_node *)0x0) {
      ~_argument_list_tree_node(this_00);
    }
    operator_delete(this_00,0x30);
    pp_Var2 = (this->children).
              super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pp_Var2 != (pointer)0x0) {
    operator_delete(pp_Var2,(long)(this->children).
                                  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pp_Var2
                   );
    return;
  }
  return;
}

Assistant:

~_argument_list_tree_node()
		{
			while (children.size() > 0)
			{
				_argument_list_tree_node* node_ptr = children.back();

				children.pop_back();

				delete node_ptr;
				node_ptr = NULL;
			}
		}